

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O0

void __thiscall Liby::PollerEpoll::removeChanel(PollerEpoll *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  double __x;
  int local_24;
  int local_20;
  int err;
  int ret;
  int fd;
  Channel *ch_local;
  PollerEpoll *this_local;
  
  bVar5 = false;
  _ret = ch;
  ch_local = (Channel *)this;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar5 = -1 < iVar1;
  }
  if (!bVar5) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                  ,0x71,"virtual void Liby::PollerEpoll::removeChanel(Channel *)");
  }
  err = Channel::get_fd(_ret);
  this_00 = Logger::getLogger();
  Channel::get_fd(_ret);
  Logger::log(this_00,__x);
  Poller::setChannel(&this->super_Poller,err,(Channel *)0x0);
  this->eventsSize_ = this->eventsSize_ - 1;
  local_20 = epoll_ctl(this->pollerfd_,2,err,(epoll_event *)0x0);
  if (local_20 < 0) {
    piVar2 = __errno_location();
    local_24 = *piVar2;
    ClearUnuseVariableWarning<int&>(&local_24);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    piVar2 = __errno_location();
    pcVar4 = strerror(*piVar2);
    *puVar3 = pcVar4;
    __cxa_throw(puVar3,&char*::typeinfo,0);
  }
  return;
}

Assistant:

void PollerEpoll::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    verbose("remove fd = %d, chan = %p\n", ch->get_fd(), ch);
    setChannel(fd, nullptr);
    eventsSize_--;

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_DEL, fd, nullptr);

    if (ret < 0) {
        int err = errno;
        ClearUnuseVariableWarning(err);
        throw ::strerror(errno);
    }
}